

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

RandSeqProductionSymbol *
slang::ast::RandSeqProductionSymbol::findProduction
          (string_view name,SourceRange nameRange,ASTContext *context)

{
  undefined8 uVar1;
  undefined4 uVar2;
  RandSeqProductionSymbol *pRVar3;
  Diagnostic *pDVar4;
  LookupLocation location;
  
  uVar1 = context->scope;
  uVar2 = context->lookupIndex;
  location.index = uVar2;
  location.scope = (Scope *)uVar1;
  location._12_4_ = 0;
  pRVar3 = (RandSeqProductionSymbol *)
           Lookup::unqualifiedAt
                     ((context->scope).ptr,name,location,nameRange,
                      (bitmask<slang::ast::LookupFlags>)0x2);
  if (pRVar3 != (RandSeqProductionSymbol *)0x0) {
    if ((pRVar3->super_Symbol).kind == RandSeqProduction) {
      return pRVar3;
    }
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x8e0006,nameRange);
    pDVar4 = Diagnostic::operator<<(pDVar4,name);
    Diagnostic::addNote(pDVar4,(DiagCode)0x50001,(pRVar3->super_Symbol).location);
  }
  return (RandSeqProductionSymbol *)0x0;
}

Assistant:

const RandSeqProductionSymbol* RandSeqProductionSymbol::findProduction(std::string_view name,
                                                                       SourceRange nameRange,
                                                                       const ASTContext& context) {
    auto symbol = Lookup::unqualifiedAt(*context.scope, name, context.getLocation(), nameRange,
                                        LookupFlags::AllowDeclaredAfter);
    if (!symbol)
        return nullptr;

    if (symbol->kind != SymbolKind::RandSeqProduction) {
        auto& diag = context.addDiag(diag::NotAProduction, nameRange) << name;
        diag.addNote(diag::NoteDeclarationHere, symbol->location);
        return nullptr;
    }

    return &symbol->as<RandSeqProductionSymbol>();
}